

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# okim6295.c
# Opt level: O2

void okim6295_w(void *info,UINT8 offset,UINT8 data)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  ushort uVar4;
  byte bVar5;
  undefined7 in_register_00000031;
  long lVar6;
  uint uVar7;
  int iVar8;
  uint uVar9;
  
  switch(CONCAT71(in_register_00000031,offset) & 0xffffffff) {
  case 0:
    if (*(short *)((long)info + 200) == -1) {
      if (-1 < (char)data) {
        bVar5 = data >> 3;
        for (lVar6 = 0x20; lVar6 != 0xe0; lVar6 = lVar6 + 0x30) {
          if ((bVar5 & 1) != 0) {
            *(undefined1 *)((long)info + lVar6) = 0;
          }
          bVar5 = bVar5 >> 1;
        }
        return;
      }
      uVar4 = (ushort)(data & 0x7f);
    }
    else {
      bVar5 = data >> 4;
      for (lVar6 = 0; lVar6 != 0xc0; lVar6 = lVar6 + 0x30) {
        if (((bVar5 & 1) != 0) && (*(char *)((long)info + lVar6 + 0x20) == '\0')) {
          iVar8 = (int)*(short *)((long)info + 200);
          bVar1 = memory_raw_read_byte((okim6295_state *)info,iVar8 * 8);
          bVar2 = memory_raw_read_byte((okim6295_state *)info,iVar8 * 8 + 1);
          bVar3 = memory_raw_read_byte((okim6295_state *)info,iVar8 * 8 + 2);
          uVar7 = (bVar1 & 3) << 0x10 | (uint)bVar2 << 8 | (uint)bVar3;
          bVar1 = memory_raw_read_byte((okim6295_state *)info,iVar8 * 8 + 3);
          bVar2 = memory_raw_read_byte((okim6295_state *)info,iVar8 * 8 + 4);
          bVar3 = memory_raw_read_byte((okim6295_state *)info,iVar8 * 8 + 5);
          uVar9 = (bVar1 & 3) << 0x10 | (uint)bVar2 << 8 | (uint)bVar3;
          iVar8 = uVar9 - uVar7;
          if (uVar9 < uVar7 || iVar8 == 0) {
            *(undefined1 *)((long)info + lVar6 + 0x20) = 0;
          }
          else {
            *(undefined1 *)((long)info + lVar6 + 0x20) = 1;
            *(uint *)((long)info + lVar6 + 0x24) = uVar7;
            *(undefined4 *)((long)info + lVar6 + 0x28) = 0;
            *(int *)((long)info + lVar6 + 0x2c) = iVar8 * 2 + 2;
            oki_adpcm_reset((oki_adpcm_state *)((long)info + lVar6 + 8));
            *(int *)((long)info + lVar6 + 0x30) = volume_table[data & 0xf];
          }
        }
        bVar5 = bVar5 >> 1;
      }
      uVar4 = 0xffff;
    }
    *(ushort *)((long)info + 200) = uVar4;
    break;
  case 8:
    *(UINT8 *)((long)info + 0xd8) = data;
    break;
  case 9:
    *(UINT8 *)((long)info + 0xd9) = data;
    break;
  case 10:
    *(UINT8 *)((long)info + 0xda) = data;
    break;
  case 0xb:
    *(UINT8 *)((long)info + 0xdb) = data;
    goto LAB_001592b3;
  case 0xc:
    *(UINT8 *)((long)info + 0xd0) = data;
LAB_001592b3:
    okim6295_clock_changed((okim6295_state *)info);
    return;
  case 0xe:
    *(UINT8 *)((long)info + 0xd2) = data;
    break;
  case 0xf:
    *(uint *)((long)info + 0xcc) = (uint)data << 0x12;
    break;
  case 0x10:
  case 0x11:
  case 0x12:
  case 0x13:
    *(UINT8 *)((long)info + (ulong)(offset & 3) + 0xd3) = data;
  }
  return;
}

Assistant:

static void okim6295_w(void* info, UINT8 offset, UINT8 data)
{
	okim6295_state *chip = (okim6295_state *)info;
	
	switch(offset)
	{
	case 0x00:
		okim6295_write_command(chip, data);
		break;
	case 0x08:
		chip->master_clock &= ~0x000000FF;
		chip->master_clock |= data <<  0;
		break;
	case 0x09:
		chip->master_clock &= ~0x0000FF00;
		chip->master_clock |= data <<  8;
		break;
	case 0x0A:
		chip->master_clock &= ~0x00FF0000;
		chip->master_clock |= data << 16;
		break;
	case 0x0B:
		chip->master_clock &= ~0xFF000000;
		chip->master_clock |= data << 24;
		okim6295_clock_changed(chip);
		break;
	case 0x0C:
		okim6295_set_pin7(chip, data);
		break;
	case 0x0E:	// NMK112 bank switch enable
		chip->nmk_mode = data;
		break;
	case 0x0F:
		okim6295_set_bank_base(chip, data << 18);
		break;
	case 0x10:
	case 0x11:
	case 0x12:
	case 0x13:
		chip->nmk_bank[offset & 0x03] = data;
		break;
	}
	
	return;
}